

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseOptionNamePart
          (Parser *this,UninterpretedOption *uninterpreted_option,LocationRecorder *part_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int iVar2;
  Type *pTVar3;
  ArenaStringPtr *this_00;
  LocationRecorder location;
  string identifier;
  LocationRecorder local_60;
  string local_50;
  
  pTVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                     (&(uninterpreted_option->name_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar2 == 0) {
    bVar1 = Consume(this,"(");
    if (bVar1) {
      LocationRecorder::LocationRecorder(&local_60,part_location,1);
      if ((this->input_->current_).type == TYPE_IDENTIFIER) {
        bVar1 = ConsumeIdentifier(this,&local_50,"Expected identifier.");
        if (!bVar1) goto LAB_002d260a;
        *(byte *)(pTVar3->_has_bits_).has_bits_ = (byte)(pTVar3->_has_bits_).has_bits_[0] | 1;
        if ((pTVar3->name_part_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
        {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (&pTVar3->name_part_,(string *)&internal::fixed_address_empty_string_abi_cxx11_)
          ;
        }
        std::__cxx11::string::_M_append
                  ((char *)(pTVar3->name_part_).ptr_,(ulong)local_50._M_dataplus._M_p);
      }
      this_00 = &pTVar3->name_part_;
      while( true ) {
        iVar2 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar2 != 0) break;
        bVar1 = Consume(this,".");
        if (!bVar1) goto LAB_002d260a;
        *(byte *)(pTVar3->_has_bits_).has_bits_ = (byte)(pTVar3->_has_bits_).has_bits_[0] | 1;
        if ((pTVar3->name_part_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
        {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        std::__cxx11::string::append((char *)this_00->ptr_);
        bVar1 = ConsumeIdentifier(this,&local_50,"Expected identifier.");
        if (!bVar1) goto LAB_002d260a;
        *(byte *)(pTVar3->_has_bits_).has_bits_ = (byte)(pTVar3->_has_bits_).has_bits_[0] | 1;
        if ((pTVar3->name_part_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
        {
          internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        std::__cxx11::string::_M_append((char *)this_00->ptr_,(ulong)local_50._M_dataplus._M_p);
      }
      LocationRecorder::~LocationRecorder(&local_60);
      bVar1 = Consume(this,")");
      if (bVar1) {
        *(byte *)(pTVar3->_has_bits_).has_bits_ = (byte)(pTVar3->_has_bits_).has_bits_[0] | 2;
        pTVar3->is_extension_ = true;
        goto LAB_002d24de;
      }
    }
  }
  else {
    LocationRecorder::LocationRecorder(&local_60,part_location,1);
    bVar1 = ConsumeIdentifier(this,&local_50,"Expected identifier.");
    if (bVar1) {
      *(byte *)(pTVar3->_has_bits_).has_bits_ = (byte)(pTVar3->_has_bits_).has_bits_[0] | 1;
      if ((pTVar3->name_part_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (&pTVar3->name_part_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      std::__cxx11::string::_M_append
                ((char *)(pTVar3->name_part_).ptr_,(ulong)local_50._M_dataplus._M_p);
      *(byte *)(pTVar3->_has_bits_).has_bits_ = (byte)(pTVar3->_has_bits_).has_bits_[0] | 2;
      pTVar3->is_extension_ = false;
      LocationRecorder::~LocationRecorder(&local_60);
      if (bVar1) {
LAB_002d24de:
        bVar1 = true;
        goto LAB_002d2616;
      }
    }
    else {
LAB_002d260a:
      LocationRecorder::~LocationRecorder(&local_60);
    }
  }
  bVar1 = false;
LAB_002d2616:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool Parser::ParseOptionNamePart(UninterpretedOption* uninterpreted_option,
                                 const LocationRecorder& part_location,
                                 const FileDescriptorProto* containing_file) {
  UninterpretedOption::NamePart* name = uninterpreted_option->add_name();
  string identifier;  // We parse identifiers into this string.
  if (LookingAt("(")) {  // This is an extension.
    DO(Consume("("));

    {
      LocationRecorder location(
          part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
      // An extension name consists of dot-separated identifiers, and may begin
      // with a dot.
      if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
      while (LookingAt(".")) {
        DO(Consume("."));
        name->mutable_name_part()->append(".");
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
    }

    DO(Consume(")"));
    name->set_is_extension(true);
  } else {  // This is a regular field.
    LocationRecorder location(
        part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    name->mutable_name_part()->append(identifier);
    name->set_is_extension(false);
  }
  return true;
}